

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType0.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GridDataType0::GridDataType0
          (GridDataType0 *this,KUINT16 SampleType,KUINT16 DataRepresentation,KDataStream *stream)

{
  ushort local_30;
  uchar local_2d [5];
  KUINT16 i;
  KUINT8 tmp;
  KDataStream *local_20;
  KDataStream *stream_local;
  KUINT16 DataRepresentation_local;
  GridDataType0 *pGStack_10;
  KUINT16 SampleType_local;
  GridDataType0 *this_local;
  
  local_20 = stream;
  stream_local._4_2_ = DataRepresentation;
  stream_local._6_2_ = SampleType;
  pGStack_10 = this;
  GridData::GridData(&this->super_GridData);
  (this->super_GridData).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GridDataType0_00334d20;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_vui8DataVals);
  (this->super_GridData).m_ui16SmpTyp = stream_local._6_2_;
  (this->super_GridData).m_ui16DtRep = stream_local._4_2_;
  KDataStream::operator>>(local_20,(unsigned_short *)&(this->super_GridData).field_0xc);
  local_2d[0] = '\0';
  for (local_30 = 0; local_30 < *(ushort *)&(this->super_GridData).field_0xc;
      local_30 = local_30 + 1) {
    KDataStream::operator>>(local_20,local_2d);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&this->m_vui8DataVals,local_2d);
  }
  if ((uint)*(ushort *)&(this->super_GridData).field_0xc % 2 == 1) {
    KDataStream::operator>>(local_20,&this->m_ui8Padding);
  }
  return;
}

Assistant:

GridDataType0::GridDataType0( KUINT16 SampleType, KUINT16 DataRepresentation, KDataStream & stream )
{
    m_ui16SmpTyp = SampleType;
    m_ui16DtRep = DataRepresentation;

    stream >> m_ui16NumBytes;

    KUINT8 tmp = 0;
    for( KUINT16 i = 0; i < m_ui16NumBytes; ++i )
    {
        stream >> tmp;
        m_vui8DataVals.push_back( tmp );
    }

    // Do we need to extract any padding?
    if( m_ui16NumBytes % 2 == 1 )
    {
        stream >> m_ui8Padding;
    }
}